

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,SingleMethodArg *ptr)

{
  allocator<char> local_39;
  string local_38;
  SingleMethodArg *local_18;
  SingleMethodArg *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (SingleMethodArg *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"single arg",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  arrow(this,local_18,local_18->arg);
  (**(local_18->arg->super_Base)._vptr_Base)(local_18->arg,this);
  return;
}

Assistant:

void gv_visitor::visit(SingleMethodArg* ptr) {
    box(ptr, "single arg");
    arrow(ptr, ptr->arg);
    ptr->arg->accept(this);
}